

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleSource(cmSetPropertyCommand *this,cmSourceFile *sf)

{
  char *local_28;
  char *value;
  string *name;
  cmSourceFile *sf_local;
  cmSetPropertyCommand *this_local;
  
  local_28 = (char *)std::__cxx11::string::c_str();
  if ((this->Remove & 1U) != 0) {
    local_28 = (char *)0x0;
  }
  if ((this->AppendMode & 1U) == 0) {
    cmSourceFile::SetProperty(sf,&this->PropertyName,local_28);
  }
  else {
    cmSourceFile::AppendProperty(sf,&this->PropertyName,local_28,(bool)(this->AppendAsString & 1));
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleSource(cmSourceFile* sf)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = nullptr;
  }

  if (this->AppendMode) {
    sf->AppendProperty(name, value, this->AppendAsString);
  } else {
    sf->SetProperty(name, value);
  }
  return true;
}